

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_zip_entry_read(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  char *zMap;
  char *pcStack_40;
  int iLength;
  char *zData;
  zip_raw_data *pRaw;
  SyArchiveEntry *pEntry;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar2 = jx9_value_is_resource(*apArg), iVar2 == 0)) {
    jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
    jx9_result_bool(pCtx,0);
  }
  else {
    pvVar3 = jx9_value_to_resource(*apArg);
    if ((pvVar3 == (void *)0x0) || (*(int *)((long)pvVar3 + 0xa0) != -0x21529ca6)) {
      jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
      jx9_result_bool(pCtx,0);
    }
    else if (*(uint *)((long)pvVar3 + 8) < *(uint *)((long)pvVar3 + 4)) {
      zMap._4_4_ = 0x400;
      if ((1 < nArg) && (zMap._4_4_ = jx9_value_to_int(apArg[1]), (int)zMap._4_4_ < 1)) {
        zMap._4_4_ = 0x400;
      }
      if ((uint)(*(int *)((long)pvVar3 + 4) - *(int *)((long)pvVar3 + 8)) < zMap._4_4_) {
        zMap._4_4_ = *(int *)((long)pvVar3 + 4) - *(int *)((long)pvVar3 + 8);
      }
      piVar1 = *(int **)((long)pvVar3 + 0x98);
      if (*piVar1 == 2) {
        pcStack_40 = (char *)(*(long *)(piVar1 + 4) +
                             (ulong)(uint)(*(int *)((long)pvVar3 + 0x48) +
                                          *(int *)((long)pvVar3 + 8)));
      }
      else {
        pcStack_40 = (char *)(*(long *)(piVar1 + 2) +
                             (ulong)(uint)(*(int *)((long)pvVar3 + 0x48) +
                                          *(int *)((long)pvVar3 + 8)));
      }
      *(uint *)((long)pvVar3 + 8) = zMap._4_4_ + *(int *)((long)pvVar3 + 8);
      jx9_result_string(pCtx,pcStack_40,zMap._4_4_);
    }
    else {
      jx9_result_bool(pCtx,0);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_read(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	zip_raw_data *pRaw;
	const char *zData;
	int iLength;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zData = 0;
	if( pEntry->nReadCount >= pEntry->nByteCompr ){
		/* No more data to read, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set a default read length */
	iLength = 1024;
	if( nArg > 1 ){
		iLength = jx9_value_to_int(apArg[1]);
		if( iLength < 1 ){
			iLength = 1024;
		}
	}
	if( (sxu32)iLength > pEntry->nByteCompr - pEntry->nReadCount ){
		iLength = (int)(pEntry->nByteCompr - pEntry->nReadCount);
	}
	/* Return the entry contents */
	pRaw = (zip_raw_data *)pEntry->pUserData;
	if( pRaw->iType == ZIP_RAW_DATA_MEMBUF ){
		zData = (const char *)SyBlobDataAt(&pRaw->raw.sBlob, (pEntry->nOfft+pEntry->nReadCount));
	}else{
		const char *zMap = (const char *)pRaw->raw.mmap.pMap;
		/* Memory mmaped chunk */
		zData = &zMap[pEntry->nOfft+pEntry->nReadCount];
	}
	/* Increment the read counter */
	pEntry->nReadCount += iLength;
	/* Return the raw data */
	jx9_result_string(pCtx, zData, iLength);
	return JX9_OK;
}